

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void Rml::Parse::Additive(DataParser *parser)

{
  bool bVar1;
  char cVar2;
  bool looping;
  DataParser *parser_local;
  
  Term(parser);
  bVar1 = true;
  while (bVar1) {
    cVar2 = DataParser::Look(parser);
    if (cVar2 == '+') {
      Add(parser);
    }
    else if (cVar2 == '-') {
      Subtract(parser);
    }
    else {
      bVar1 = false;
    }
  }
  return;
}

Assistant:

static void Additive(DataParser& parser)
	{
		Term(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '+': Add(parser); break;
			case '-': Subtract(parser); break;
			default: looping = false;
			}
		}
	}